

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmainct.c
# Opt level: O2

void process_data_simple_main
               (j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
               JDIMENSION in_rows_avail)

{
  JDIMENSION *pJVar1;
  JDIMENSION JVar2;
  jpeg_c_main_controller *pjVar3;
  boolean bVar4;
  uint uVar5;
  
  pjVar3 = cinfo->main;
  pJVar1 = (JDIMENSION *)((long)&pjVar3[1].start_pass + 4);
  uVar5 = *(uint *)&pjVar3[1].start_pass;
  while( true ) {
    if (cinfo->total_iMCU_rows <= uVar5) {
      return;
    }
    JVar2 = *pJVar1;
    uVar5 = cinfo->min_DCT_v_scaled_size;
    if (JVar2 < uVar5) {
      (*cinfo->prep->pre_process_data)
                (cinfo,input_buf,in_row_ctr,in_rows_avail,(JSAMPIMAGE)(pjVar3 + 2),pJVar1,uVar5);
      JVar2 = *pJVar1;
      uVar5 = cinfo->min_DCT_v_scaled_size;
    }
    if (JVar2 != uVar5) break;
    bVar4 = (*cinfo->coef->compress_data)(cinfo,(JSAMPIMAGE)(pjVar3 + 2));
    if (bVar4 == 0) {
      if (*(int *)&pjVar3[1].process_data != 0) {
        return;
      }
      *in_row_ctr = *in_row_ctr - 1;
      *(undefined4 *)&pjVar3[1].process_data = 1;
      return;
    }
    if (*(int *)&pjVar3[1].process_data != 0) {
      *in_row_ctr = *in_row_ctr + 1;
      *(undefined4 *)&pjVar3[1].process_data = 0;
    }
    *(undefined4 *)((long)&pjVar3[1].start_pass + 4) = 0;
    uVar5 = *(int *)&pjVar3[1].start_pass + 1;
    *(uint *)&pjVar3[1].start_pass = uVar5;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_simple_main (j_compress_ptr cinfo,
			  JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
			  JDIMENSION in_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;

  while (main->cur_iMCU_row < cinfo->total_iMCU_rows) {
    /* Read input data if we haven't filled the main buffer yet */
    if (main->rowgroup_ctr < (JDIMENSION) cinfo->min_DCT_v_scaled_size)
      (*cinfo->prep->pre_process_data) (cinfo,
					input_buf, in_row_ctr, in_rows_avail,
					main->buffer, &main->rowgroup_ctr,
					(JDIMENSION) cinfo->min_DCT_v_scaled_size);

    /* If we don't have a full iMCU row buffered, return to application for
     * more data.  Note that preprocessor will always pad to fill the iMCU row
     * at the bottom of the image.
     */
    if (main->rowgroup_ctr != (JDIMENSION) cinfo->min_DCT_v_scaled_size)
      return;

    /* Send the completed row to the compressor */
    if (! (*cinfo->coef->compress_data) (cinfo, main->buffer)) {
      /* If compressor did not consume the whole row, then we must need to
       * suspend processing and return to the application.  In this situation
       * we pretend we didn't yet consume the last input row; otherwise, if
       * it happened to be the last row of the image, the application would
       * think we were done.
       */
      if (! main->suspended) {
	(*in_row_ctr)--;
	main->suspended = TRUE;
      }
      return;
    }
    /* We did finish the row.  Undo our little suspension hack if a previous
     * call suspended; then mark the main buffer empty.
     */
    if (main->suspended) {
      (*in_row_ctr)++;
      main->suspended = FALSE;
    }
    main->rowgroup_ctr = 0;
    main->cur_iMCU_row++;
  }
}